

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_2.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  double dVar2;
  double k;
  double c;
  
  c._4_4_ = 0;
  k = 0.0;
  std::istream::operator>>((istream *)&std::cin,&k);
  dVar2 = ctok(k);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar2);
  std::operator<<(poVar1,'\n');
  return 0;
}

Assistant:

int main()
{
	double c = 0;// declare input variable
	std::cin >> c;// retrieve temperature to input variable
	double k = ctok(c);// convert temperature
	std::cout << k << '\n';// print out temperature
	return 0;
}